

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Array<double,_3,_3,_0,_3,_3> * __thiscall
Eigen::PlainObjectBase<Eigen::Array<double,3,3,0,3,3>>::
_set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Array<double,3,3,0,3,3>>const,Eigen::Replicate<Eigen::Array<double,3,1,0,3,1>,1,3>const>>
          (PlainObjectBase<Eigen::Array<double,3,3,0,3,3>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>_>
          *other)

{
  Array<double,_3,_3,_0,_3,_3> *pAVar1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>
  *src;
  assign_op<double,_double> local_19;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>_>
  *local_18;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>_>
  *other_local;
  PlainObjectBase<Eigen::Array<double,_3,_3,_0,_3,_3>_> *this_local;
  
  local_18 = (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>_>
              *)other;
  other_local = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>_>
                 *)this;
  pAVar1 = EigenBase<Eigen::Array<double,_3,_3,_0,_3,_3>_>::derived
                     ((EigenBase<Eigen::Array<double,_3,_3,_0,_3,_3>_> *)this);
  src = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Array<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Replicate<Eigen::Array<double,_3,_1,_0,_3,_1>,_1,_3>_>_>
        ::derived(local_18);
  internal::assign_op<double,_double>::assign_op(&local_19);
  internal::
  call_assignment_no_alias<Eigen::Array<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Array<double,3,3,0,3,3>>const,Eigen::Replicate<Eigen::Array<double,3,1,0,3,1>,1,3>const>,Eigen::internal::assign_op<double,double>>
            (pAVar1,src,&local_19);
  pAVar1 = EigenBase<Eigen::Array<double,_3,_3,_0,_3,_3>_>::derived
                     ((EigenBase<Eigen::Array<double,_3,_3,_0,_3,_3>_> *)this);
  return pAVar1;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }